

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O1

void t42_parse_sfnts(T42_Face face,T42_Loader loader)

{
  byte bVar1;
  byte *pbVar2;
  FT_Byte *pFVar3;
  bool bVar4;
  FT_Error FVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined4 extraout_var;
  FT_Byte *pFVar9;
  char cVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong local_78;
  FT_ULong real_size;
  FT_Memory local_68;
  undefined8 local_60;
  FT_Byte *local_58;
  uint local_4c;
  ulong local_48;
  byte *local_40;
  int local_38;
  FT_Error local_34 [2];
  FT_Error error;
  
  pbVar17 = (loader->parser).root.limit;
  local_68 = (loader->parser).root.memory;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar2 = (loader->parser).root.cursor;
  if ((pbVar2 < pbVar17) && ((loader->parser).root.cursor = pbVar2 + 1, *pbVar2 == 0x5b)) {
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    real_size = 0;
    pFVar9 = (FT_Byte *)0x0;
    local_60 = 0;
    iVar11 = 0;
    uVar15 = 0;
    lVar12 = 0;
    local_4c = 0;
    local_40 = pbVar17;
    do {
      pbVar2 = (loader->parser).root.cursor;
      if (pbVar17 <= pbVar2) {
        local_34[0] = 3;
        goto LAB_002393bf;
      }
      bVar1 = *pbVar2;
      if (bVar1 == 0x3c) {
        local_48 = uVar15;
        local_38 = iVar11;
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        iVar7 = 7;
        uVar15 = local_48;
        pbVar17 = local_40;
        iVar11 = local_38;
        if ((loader->parser).root.error == 0) {
          pFVar3 = (loader->parser).root.cursor;
          if ((ulong)((long)pFVar3 - (long)pbVar2) < 3) {
            local_34[0] = 3;
            iVar7 = 4;
            uVar15 = 0;
          }
          else {
            uVar15 = (long)(pFVar3 + ~(ulong)pbVar2) / 2;
            pFVar9 = (FT_Byte *)ft_mem_realloc(local_68,1,real_size,uVar15,pFVar9,local_34);
            iVar7 = 4;
            pbVar17 = local_40;
            iVar11 = local_38;
            if (local_34[0] == 0) {
              (loader->parser).root.cursor = pbVar2;
              FVar5 = (*(loader->parser).root.funcs.to_bytes)
                                ((PS_Parser)loader,pFVar9,uVar15,&local_78,'\x01');
              local_60 = CONCAT71((int7)(CONCAT44(extraout_var,FVar5) >> 8),1);
              uVar8 = local_78;
              pbVar17 = local_40;
              iVar11 = local_38;
              real_size = uVar15;
              goto LAB_00239114;
            }
          }
        }
      }
      else if (bVar1 == 0x5d) {
        (loader->parser).root.cursor = pbVar2 + 1;
        iVar7 = 7;
      }
      else {
        uVar8 = uVar15;
        if (bVar1 - 0x30 < 10) {
          if ((char)local_60 == '\0') {
            local_58 = pFVar9;
            local_38 = iVar11;
            uVar8 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
            if ((long)uVar8 < 0) {
              local_34[0] = 3;
              iVar7 = 4;
            }
            else {
              local_48 = uVar8;
              (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
              uVar15 = local_48;
              if ((loader->parser).root.error == 0) {
                pFVar3 = (loader->parser).root.cursor;
                pFVar9 = pFVar3 + 1;
                iVar11 = local_38;
                if ((ulong)((long)pbVar17 - (long)pFVar3) <= local_48) goto LAB_00238ff5;
                (loader->parser).root.cursor = pFVar3 + local_48 + 1;
                iVar7 = 0;
                bVar4 = true;
                goto LAB_0023910c;
              }
              iVar7 = 1;
            }
            bVar4 = false;
            pFVar9 = local_58;
            iVar11 = local_38;
          }
          else {
LAB_00238ff5:
            local_34[0] = 3;
            iVar7 = 4;
            bVar4 = false;
          }
LAB_0023910c:
          uVar8 = uVar15;
          if (!bVar4) goto LAB_002392f8;
        }
LAB_00239114:
        if (pFVar9 == (FT_Byte *)0x0) {
          local_34[0] = 3;
          iVar7 = 4;
          pFVar9 = (FT_Byte *)0x0;
          uVar15 = uVar8;
        }
        else {
          if (((uVar8 & 1) != 0) && (pFVar9[uVar8 - 1] == '\0')) {
            uVar8 = uVar8 - 1;
          }
          if (uVar8 == 0) {
            local_34[0] = 3;
            iVar7 = 4;
            uVar15 = 0;
          }
          else {
            uVar14 = (long)pbVar17 - (long)(loader->parser).root.cursor;
            uVar16 = 0;
            local_58 = pFVar9;
            local_48 = uVar8;
            do {
              if (iVar11 == 2) {
LAB_00239296:
                if (face->ttf_size <= lVar12) {
                  local_34[0] = 3;
                  iVar7 = 4;
                  uVar15 = uVar8;
                  pbVar17 = local_40;
                  goto LAB_002392f8;
                }
              }
              else if (iVar11 == 1) {
LAB_002391c4:
                iVar11 = 1;
                if (face->ttf_size <= lVar12) {
                  if (0 < (int)local_4c) {
                    lVar13 = 0;
                    do {
                      uVar6 = *(uint *)(face->ttf_data + lVar13 + 0x18);
                      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                              uVar6 << 0x18;
                      if ((uVar14 < uVar6) || ((long)(uVar14 - uVar6) < face->ttf_size)) {
                        local_34[0] = 3;
                        iVar7 = 4;
                        bVar4 = false;
                      }
                      else {
                        face->ttf_size = face->ttf_size + (ulong)(uVar6 + 3 & 0xfffffffc);
                        iVar7 = 0;
                        bVar4 = true;
                      }
                      if (!bVar4) {
                        iVar11 = 1;
                        goto LAB_0023928e;
                      }
                      lVar13 = lVar13 + 0x10;
                    } while ((ulong)local_4c << 4 != lVar13);
                  }
                  pFVar9 = (FT_Byte *)
                           ft_mem_realloc(local_68,1,(ulong)(local_4c << 4 | 0xc),face->ttf_size + 1
                                          ,face->ttf_data,local_34);
                  face->ttf_data = pFVar9;
                  iVar7 = (uint)(local_34[0] != 0) << 2;
                  iVar11 = 2;
                  pFVar9 = local_58;
                  uVar8 = local_48;
LAB_0023928e:
                  uVar15 = uVar8;
                  pbVar17 = local_40;
                  if (iVar7 == 0) goto LAB_00239296;
                  goto LAB_002392f8;
                }
              }
              else {
                iVar11 = 0;
                if (0xb < lVar12) {
                  pFVar3 = face->ttf_data;
                  local_4c = (uint)pFVar3[5] + (uint)pFVar3[4] * 0x10;
                  uVar15 = (ulong)(local_4c * 0x10 | 0xc);
                  face->ttf_size = uVar15;
                  if ((long)uVar14 < (long)uVar15) {
                    local_34[0] = 3;
                    iVar7 = 4;
                    uVar15 = uVar8;
                    pbVar17 = local_40;
                    iVar11 = 1;
                  }
                  else {
                    pFVar9 = (FT_Byte *)ft_mem_realloc(local_68,1,0xc,uVar15,pFVar3,local_34);
                    face->ttf_data = pFVar9;
                    pFVar9 = local_58;
                    uVar8 = local_48;
                    if (local_34[0] == 0) goto LAB_002391c4;
                    iVar7 = 4;
                    uVar15 = local_48;
                    pbVar17 = local_40;
                    iVar11 = 1;
                  }
                  goto LAB_002392f8;
                }
              }
              face->ttf_data[lVar12] = pFVar9[uVar16];
              lVar12 = lVar12 + 1;
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar8);
            (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
            iVar7 = 0;
            pFVar9 = local_58;
            uVar15 = local_48;
            pbVar17 = local_40;
          }
        }
      }
LAB_002392f8:
    } while (iVar7 == 0);
    if (iVar7 != 4) {
      cVar10 = (char)local_60;
      if (iVar7 != 7) {
        return;
      }
      goto LAB_00239389;
    }
LAB_002393bf:
    cVar10 = (char)local_60;
  }
  else {
    local_34[0] = 3;
    pFVar9 = (FT_Byte *)0x0;
    cVar10 = '\0';
  }
  (loader->parser).root.error = local_34[0];
LAB_00239389:
  if (cVar10 != '\0') {
    ft_mem_free(local_68,pFVar9);
  }
  return;
}

Assistant:

static void
  t42_parse_sfnts( T42_Face    face,
                   T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Memory   memory = parser->root.memory;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;
    FT_Error    error;
    FT_Int      num_tables = 0;
    FT_Long     count;

    FT_ULong    n, string_size, old_string_size, real_size;
    FT_Byte*    string_buf = NULL;
    FT_Bool     allocated  = 0;

    T42_Load_Status  status;


    /* The format is                                */
    /*                                              */
    /*   /sfnts [ <hexstring> <hexstring> ... ] def */
    /*                                              */
    /* or                                           */
    /*                                              */
    /*   /sfnts [                                   */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      ...                                     */
    /*   ] def                                      */
    /*                                              */
    /* with exactly one space after the `RD' token. */

    T1_Skip_Spaces( parser );

    if ( parser->root.cursor >= limit || *parser->root.cursor++ != '[' )
    {
      FT_ERROR(( "t42_parse_sfnts: can't find begin of sfnts vector\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    T1_Skip_Spaces( parser );
    status          = BEFORE_START;
    string_size     = 0;
    old_string_size = 0;
    count           = 0;

    while ( parser->root.cursor < limit )
    {
      FT_ULong  size;


      cur = parser->root.cursor;

      if ( *cur == ']' )
      {
        parser->root.cursor++;
        goto Exit;
      }

      else if ( *cur == '<' )
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        /* don't include delimiters */
        string_size = (FT_ULong)( ( parser->root.cursor - cur - 2 + 1 ) / 2 );
        if ( !string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        if ( FT_REALLOC( string_buf, old_string_size, string_size ) )
          goto Fail;

        allocated = 1;

        parser->root.cursor = cur;
        (void)T1_ToBytes( parser, string_buf, string_size, &real_size, 1 );
        old_string_size = string_size;
        string_size     = real_size;
      }

      else if ( ft_isdigit( *cur ) )
      {
        FT_Long  tmp;


        if ( allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        tmp = T1_ToInt( parser );
        if ( tmp < 0 )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid string size\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          string_size = (FT_ULong)tmp;

        T1_Skip_PS_Token( parser );             /* `RD' */
        if ( parser->root.error )
          return;

        string_buf = parser->root.cursor + 1;   /* one space after `RD' */

        if ( (FT_ULong)( limit - parser->root.cursor ) <= string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          parser->root.cursor += string_size + 1;
      }

      if ( !string_buf )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* A string can have a trailing zero (odd) byte for padding. */
      /* Ignore it.                                                */
      if ( ( string_size & 1 ) && string_buf[string_size - 1] == 0 )
        string_size--;

      if ( !string_size )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid string\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* The whole TTF is now loaded into `string_buf'.  We are */
      /* checking its contents while copying it to `ttf_data'.  */

      size = (FT_ULong)( limit - parser->root.cursor );

      for ( n = 0; n < string_size; n++ )
      {
        switch ( status )
        {
        case BEFORE_START:
          /* load offset table, 12 bytes */
          if ( count < 12 )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            num_tables     = 16 * face->ttf_data[4] + face->ttf_data[5];
            status         = BEFORE_TABLE_DIR;
            face->ttf_size = 12 + 16 * num_tables;

            if ( (FT_Long)size < face->ttf_size )
            {
              FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
              error = FT_THROW( Invalid_File_Format );
              goto Fail;
            }

            if ( FT_REALLOC( face->ttf_data, 12, face->ttf_size ) )
              goto Fail;
          }
          /* fall through */

        case BEFORE_TABLE_DIR:
          /* the offset table is read; read the table directory */
          if ( count < face->ttf_size )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            int       i;
            FT_ULong  len;


            for ( i = 0; i < num_tables; i++ )
            {
              FT_Byte*  p = face->ttf_data + 12 + 16 * i + 12;


              len = FT_PEEK_ULONG( p );
              if ( len > size                               ||
                   face->ttf_size > (FT_Long)( size - len ) )
              {
                FT_ERROR(( "t42_parse_sfnts:"
                           " invalid data in sfnts array\n" ));
                error = FT_THROW( Invalid_File_Format );
                goto Fail;
              }

              /* Pad to a 4-byte boundary length */
              face->ttf_size += (FT_Long)( ( len + 3 ) & ~3U );
            }

            status = OTHER_TABLES;

            if ( FT_REALLOC( face->ttf_data, 12 + 16 * num_tables,
                             face->ttf_size + 1 ) )
              goto Fail;
          }
          /* fall through */

        case OTHER_TABLES:
          /* all other tables are just copied */
          if ( count >= face->ttf_size )
          {
            FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }
          face->ttf_data[count++] = string_buf[n];
        }
      }

      T1_Skip_Spaces( parser );
    }

    /* if control reaches this point, the format was not valid */
    error = FT_THROW( Invalid_File_Format );

  Fail:
    parser->root.error = error;

  Exit:
    if ( allocated )
      FT_FREE( string_buf );
  }